

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O0

MeteomaticsApiClient * __thiscall
MeteomaticsApiClient::getOptionalSelectString
          (MeteomaticsApiClient *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *optionals)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong local_38;
  size_t i;
  allocator local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *optionals_local;
  string *ret;
  
  local_18 = optionals;
  optionals_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(optionals);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    i._3_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"?",(allocator *)((long)&i + 2));
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 2));
    for (local_38 = 0;
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_18), local_38 < sVar2; local_38 = local_38 + 1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_18,local_38);
      std::__cxx11::string::operator+=((string *)this,(string *)pvVar3);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_18);
      if (local_38 != sVar2 - 1) {
        std::__cxx11::string::operator+=((string *)this,"&");
      }
    }
  }
  return this;
}

Assistant:

std::string MeteomaticsApiClient::getOptionalSelectString(const std::vector<std::string>& optionals)
{
    if (optionals.empty())
    {
        return "";
    }
    
    std::string ret="?";
    for (std::size_t i=0; i<optionals.size(); i++)
    {
        ret += optionals[i];
        if (i != optionals.size()-1)
        {
            ret += "&";
        }
    }
    return ret;
}